

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pageant.c
# Opt level: O2

pageant_pubkey * pageant_pubkey_copy(pageant_pubkey *key)

{
  pageant_pubkey *ppVar1;
  strbuf *psVar2;
  char *pcVar3;
  
  pcVar3 = (char *)0x0;
  ppVar1 = (pageant_pubkey *)safemalloc(1,0x18,0);
  psVar2 = strbuf_new();
  ppVar1->blob = psVar2;
  BinarySink_put_data(psVar2->binarysink_,key->blob->s,key->blob->len);
  if (key->comment != (char *)0x0) {
    pcVar3 = dupstr(key->comment);
  }
  ppVar1->comment = pcVar3;
  ppVar1->ssh_version = key->ssh_version;
  return ppVar1;
}

Assistant:

struct pageant_pubkey *pageant_pubkey_copy(struct pageant_pubkey *key)
{
    struct pageant_pubkey *ret = snew(struct pageant_pubkey);
    ret->blob = strbuf_new();
    put_data(ret->blob, key->blob->s, key->blob->len);
    ret->comment = key->comment ? dupstr(key->comment) : NULL;
    ret->ssh_version = key->ssh_version;
    return ret;
}